

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_parse_certificate(mbedtls_ssl_context *ssl)

{
  uchar uVar1;
  uchar uVar2;
  mbedtls_ssl_ciphersuite_t *ciphersuite;
  uchar *puVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  mbedtls_x509_crt *pmVar8;
  ulong uVar9;
  long lVar10;
  mbedtls_pk_context *ctx;
  mbedtls_ecp_keypair *pmVar11;
  mbedtls_pk_context *pk;
  mbedtls_x509_crl *ca_crl;
  mbedtls_x509_crt *ca_chain;
  int authmode;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  size_t n;
  size_t i;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  ciphersuite = ssl->transform_negotiate->ciphersuite_info;
  ca_chain._4_4_ = *(uint *)&ssl->conf->field_0x174 >> 2 & 3;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x107f,"=> parse certificate");
  if ((((ciphersuite->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK) ||
       (ciphersuite->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK)) ||
      (ciphersuite->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK)) ||
     (ciphersuite->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x1086,"<= skip parse certificate");
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = 0;
  }
  else if (((*(uint *)&ssl->conf->field_0x174 & 1) == 1) &&
          (ciphersuite->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x108f,"<= skip parse certificate");
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = 0;
  }
  else {
    if (ssl->handshake->sni_authmode != 3) {
      ca_chain._4_4_ = ssl->handshake->sni_authmode;
    }
    if (((*(uint *)&ssl->conf->field_0x174 & 1) == 1) && (ca_chain._4_4_ == 0)) {
      ssl->session_negotiate->verify_result = 0x80;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x109d,"<= skip parse certificate");
      ssl->state = ssl->state + 1;
      ssl_local._4_4_ = 0;
    }
    else {
      i._4_4_ = mbedtls_ssl_read_record(ssl);
      if (i._4_4_ == 0) {
        ssl->state = ssl->state + 1;
        if (((((*(uint *)&ssl->conf->field_0x174 & 1) == 1) && (ssl->minor_ver != 0)) &&
            (sVar6 = ssl->in_hslen, sVar5 = mbedtls_ssl_hs_hdr_len(ssl), sVar6 == sVar5 + 3)) &&
           ((ssl->in_msgtype == 0x16 && (*ssl->in_msg == '\v')))) {
          puVar3 = ssl->in_msg;
          sVar6 = mbedtls_ssl_hs_hdr_len(ssl);
          iVar4 = memcmp(puVar3 + sVar6,"",3);
          if (iVar4 == 0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x10cd,"TLSv1 client has no certificate");
            ssl->session_negotiate->verify_result = 0x40;
            if (ca_chain._4_4_ == 1) {
              return 0;
            }
            return -0x7480;
          }
        }
        if (ssl->in_msgtype == 0x16) {
          if ((*ssl->in_msg == '\v') &&
             (uVar9 = ssl->in_hslen, sVar6 = mbedtls_ssl_hs_hdr_len(ssl), sVar6 + 6 <= uVar9)) {
            sVar6 = mbedtls_ssl_hs_hdr_len(ssl);
            uVar1 = ssl->in_msg[sVar6 + 1];
            uVar2 = ssl->in_msg[sVar6 + 2];
            if ((ssl->in_msg[sVar6] == '\0') &&
               (sVar5 = ssl->in_hslen, sVar7 = mbedtls_ssl_hs_hdr_len(ssl),
               sVar5 == (long)(int)(uint)CONCAT11(uVar1,uVar2) + 3 + sVar7)) {
              if (ssl->session_negotiate->peer_cert != (mbedtls_x509_crt *)0x0) {
                mbedtls_x509_crt_free(ssl->session_negotiate->peer_cert);
                free(ssl->session_negotiate->peer_cert);
              }
              pmVar8 = (mbedtls_x509_crt *)calloc(1,0x228);
              ssl->session_negotiate->peer_cert = pmVar8;
              if (pmVar8 == (mbedtls_x509_crt *)0x0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                           ,0x1100,"alloc(%d bytes) failed",0x228);
                ssl_local._4_4_ = -0x7f00;
              }
              else {
                mbedtls_x509_crt_init(ssl->session_negotiate->peer_cert);
                n = sVar6 + 3;
                while (n < ssl->in_hslen) {
                  if (ssl->in_msg[n] != '\0') {
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                               ,0x110c,"bad certificate message");
                    return -0x7a00;
                  }
                  uVar9 = (ulong)CONCAT11(ssl->in_msg[n + 1],ssl->in_msg[n + 2]);
                  lVar10 = n + 3;
                  if ((uVar9 < 0x80) || (ssl->in_hslen < lVar10 + uVar9)) {
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                               ,0x1116,"bad certificate message");
                    return -0x7a00;
                  }
                  i._4_4_ = mbedtls_x509_crt_parse_der
                                      (ssl->session_negotiate->peer_cert,ssl->in_msg + lVar10,uVar9)
                  ;
                  if ((i._4_4_ != 0) && (i._4_4_ != -0x262e)) {
                    mbedtls_debug_print_ret
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                               ,0x111e," mbedtls_x509_crt_parse_der",i._4_4_);
                    return i._4_4_;
                  }
                  n = uVar9 + lVar10;
                }
                mbedtls_debug_print_crt
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                           ,0x1125,"peer certificate",ssl->session_negotiate->peer_cert);
                if (((*(uint *)&ssl->conf->field_0x174 & 1) == 0) && (ssl->renego_status == 1)) {
                  if (ssl->session->peer_cert == (mbedtls_x509_crt *)0x0) {
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                               ,0x1131,"new server cert during renegotiation");
                    return -0x7a00;
                  }
                  if (((ssl->session->peer_cert->raw).len !=
                       (ssl->session_negotiate->peer_cert->raw).len) ||
                     (iVar4 = memcmp((ssl->session->peer_cert->raw).p,
                                     (ssl->session_negotiate->peer_cert->raw).p,
                                     (ssl->session->peer_cert->raw).len), iVar4 != 0)) {
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                               ,0x113b,"server cert changed during renegotiation");
                    return -0x7a00;
                  }
                }
                if (ca_chain._4_4_ != 0) {
                  if (ssl->handshake->sni_ca_chain == (mbedtls_x509_crt *)0x0) {
                    ca_crl = (mbedtls_x509_crl *)ssl->conf->ca_chain;
                    pk = (mbedtls_pk_context *)ssl->conf->ca_crl;
                  }
                  else {
                    ca_crl = (mbedtls_x509_crl *)ssl->handshake->sni_ca_chain;
                    pk = (mbedtls_pk_context *)ssl->handshake->sni_ca_crl;
                  }
                  if (ca_crl == (mbedtls_x509_crl *)0x0) {
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                               ,0x1155,"got no CA chain");
                    return -0x7680;
                  }
                  i._4_4_ = mbedtls_x509_crt_verify_with_profile
                                      (ssl->session_negotiate->peer_cert,(mbedtls_x509_crt *)ca_crl,
                                       (mbedtls_x509_crl *)pk,ssl->conf->cert_profile,ssl->hostname,
                                       &ssl->session_negotiate->verify_result,ssl->conf->f_vrfy,
                                       ssl->conf->p_vrfy);
                  if (i._4_4_ != 0) {
                    mbedtls_debug_print_ret
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                               ,0x1166,"x509_verify_cert",i._4_4_);
                  }
                  ctx = &ssl->session_negotiate->peer_cert->pk;
                  iVar4 = mbedtls_pk_can_do(ctx,MBEDTLS_PK_ECKEY);
                  if (iVar4 != 0) {
                    pmVar11 = mbedtls_pk_ec(*ctx);
                    iVar4 = mbedtls_ssl_check_curve(ssl,(pmVar11->grp).id);
                    if ((iVar4 != 0) &&
                       (mbedtls_debug_print_msg
                                  (ssl,1,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                                   ,0x1175,"bad certificate (EC key curve)"), i._4_4_ == 0)) {
                      i._4_4_ = -0x7a00;
                    }
                  }
                  iVar4 = mbedtls_ssl_check_cert_usage
                                    (ssl->session_negotiate->peer_cert,ciphersuite,
                                     (uint)(((*(uint *)&ssl->conf->field_0x174 & 1) != 0 ^ 0xffU) &
                                           1),&ssl->session_negotiate->verify_result);
                  if ((iVar4 != 0) &&
                     (mbedtls_debug_print_msg
                                (ssl,1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                                 ,0x1181,"bad certificate (usage extensions)"), i._4_4_ == 0)) {
                    i._4_4_ = -0x7a00;
                  }
                  if (ca_chain._4_4_ == 1) {
                    i._4_4_ = 0;
                  }
                }
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                           ,0x118a,"<= parse certificate");
                ssl_local._4_4_ = i._4_4_;
              }
            }
            else {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0x10f1,"bad certificate message");
              ssl_local._4_4_ = -0x7a00;
            }
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x10e3,"bad certificate message");
            ssl_local._4_4_ = -0x7a00;
          }
        }
        else {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0x10dc,"bad certificate message");
          ssl_local._4_4_ = -0x7700;
        }
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x10a5,"mbedtls_ssl_read_record",i._4_4_);
        ssl_local._4_4_ = i._4_4_;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_parse_certificate( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, n;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    int authmode = ssl->conf->authmode;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_authmode != MBEDTLS_SSL_VERIFY_UNSET )
        authmode = ssl->handshake->sni_authmode;
#endif

    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        authmode == MBEDTLS_SSL_VERIFY_NONE )
    {
        ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_SKIP_VERIFY;
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }
#endif

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    ssl->state++;

#if defined(MBEDTLS_SSL_SRV_C)
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    /*
     * Check if the client sent an empty certificate
     */
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_msglen  == 2                        &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_ALERT            &&
            ssl->in_msg[0]  == MBEDTLS_SSL_ALERT_LEVEL_WARNING  &&
            ssl->in_msg[1]  == MBEDTLS_SSL_ALERT_MSG_NO_CERT )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "SSLv3 client has no certificate" ) );

            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_SSL3 */

#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_hslen   == 3 + mbedtls_ssl_hs_hdr_len( ssl ) &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE    &&
            ssl->in_msg[0]  == MBEDTLS_SSL_HS_CERTIFICATE   &&
            memcmp( ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl ), "\0\0\0", 3 ) == 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLSv1 client has no certificate" ) );

            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
#endif /* MBEDTLS_SSL_SRV_C */

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_CERTIFICATE ||
        ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 3 + 3 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    i = mbedtls_ssl_hs_hdr_len( ssl );

    /*
     * Same message structure as in mbedtls_ssl_write_certificate()
     */
    n = ( ssl->in_msg[i+1] << 8 ) | ssl->in_msg[i+2];

    if( ssl->in_msg[i] != 0 ||
        ssl->in_hslen != n + 3 + mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    /* In case we tried to reuse a session but it failed */
    if( ssl->session_negotiate->peer_cert != NULL )
    {
        mbedtls_x509_crt_free( ssl->session_negotiate->peer_cert );
        mbedtls_free( ssl->session_negotiate->peer_cert );
    }

    if( ( ssl->session_negotiate->peer_cert = mbedtls_calloc( 1,
                    sizeof( mbedtls_x509_crt ) ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed",
                       sizeof( mbedtls_x509_crt ) ) );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    mbedtls_x509_crt_init( ssl->session_negotiate->peer_cert );

    i += 3;

    while( i < ssl->in_hslen )
    {
        if( ssl->in_msg[i] != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        n = ( (unsigned int) ssl->in_msg[i + 1] << 8 )
            | (unsigned int) ssl->in_msg[i + 2];
        i += 3;

        if( n < 128 || i + n > ssl->in_hslen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        ret = mbedtls_x509_crt_parse_der( ssl->session_negotiate->peer_cert,
                                  ssl->in_msg + i, n );
        if( 0 != ret && ( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG + MBEDTLS_ERR_OID_NOT_FOUND ) != ret )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, " mbedtls_x509_crt_parse_der", ret );
            return( ret );
        }

        i += n;
    }

    MBEDTLS_SSL_DEBUG_CRT( 3, "peer certificate", ssl->session_negotiate->peer_cert );

    /*
     * On client, make sure the server cert doesn't change during renego to
     * avoid "triple handshake" attack: https://secure-resumption.com/
     */
#if defined(MBEDTLS_SSL_RENEGOTIATION) && defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
        ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
    {
        if( ssl->session->peer_cert == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "new server cert during renegotiation" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        if( ssl->session->peer_cert->raw.len !=
            ssl->session_negotiate->peer_cert->raw.len ||
            memcmp( ssl->session->peer_cert->raw.p,
                    ssl->session_negotiate->peer_cert->raw.p,
                    ssl->session->peer_cert->raw.len ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "server cert changed during renegotiation" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_RENEGOTIATION && MBEDTLS_SSL_CLI_C */

    if( authmode != MBEDTLS_SSL_VERIFY_NONE )
    {
        mbedtls_x509_crt *ca_chain;
        mbedtls_x509_crl *ca_crl;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
        if( ssl->handshake->sni_ca_chain != NULL )
        {
            ca_chain = ssl->handshake->sni_ca_chain;
            ca_crl   = ssl->handshake->sni_ca_crl;
        }
        else
#endif
        {
            ca_chain = ssl->conf->ca_chain;
            ca_crl   = ssl->conf->ca_crl;
        }

        if( ca_chain == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no CA chain" ) );
            return( MBEDTLS_ERR_SSL_CA_CHAIN_REQUIRED );
        }

        /*
         * Main check: verify certificate
         */
        ret = mbedtls_x509_crt_verify_with_profile(
                                ssl->session_negotiate->peer_cert,
                                ca_chain, ca_crl,
                                ssl->conf->cert_profile,
                                ssl->hostname,
                               &ssl->session_negotiate->verify_result,
                                ssl->conf->f_vrfy, ssl->conf->p_vrfy );

        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "x509_verify_cert", ret );
        }

        /*
         * Secondary checks: always done, but change 'ret' only if it was 0
         */

#if defined(MBEDTLS_ECP_C)
        {
            const mbedtls_pk_context *pk = &ssl->session_negotiate->peer_cert->pk;

            /* If certificate uses an EC key, make sure the curve is OK */
            if( mbedtls_pk_can_do( pk, MBEDTLS_PK_ECKEY ) &&
                mbedtls_ssl_check_curve( ssl, mbedtls_pk_ec( *pk )->grp.id ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (EC key curve)" ) );
                if( ret == 0 )
                    ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
            }
        }
#endif /* MBEDTLS_ECP_C */

        if( mbedtls_ssl_check_cert_usage( ssl->session_negotiate->peer_cert,
                                  ciphersuite_info,
                                  ! ssl->conf->endpoint,
                                 &ssl->session_negotiate->verify_result ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (usage extensions)" ) );
            if( ret == 0 )
                ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
        }

        if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
            ret = 0;
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate" ) );

    return( ret );
}